

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O3

void __thiscall
amrex::MLEBABecLap::FFlux
          (MLEBABecLap *this,int amrlev,MFIter *mfi,Array<FArrayBox_*,_3> *flux,FArrayBox *sol,
          Location flux_loc,int face_only)

{
  Box *pBVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Location LVar16;
  Location LVar17;
  Vector<int,_std::allocator<int>_> *pVVar18;
  FArrayBox *pFVar19;
  FArrayBox *pFVar20;
  FArrayBox *pFVar21;
  FArrayBox *pFVar22;
  FArrayBox *pFVar23;
  FArrayBox *pFVar24;
  FabArray<amrex::IArrayBox> *this_00;
  double *pdVar25;
  double *pdVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  uint ncomp;
  FabType FVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  FabArray<amrex::EBCellFlagFab> *pFVar38;
  ulong uVar39;
  int iVar40;
  int *piVar41;
  ulong uVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  int iVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  int iVar64;
  long lVar65;
  long lVar66;
  int *piVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  int iVar73;
  double *pdVar74;
  long lVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  double *pdVar80;
  undefined8 uVar81;
  int lof;
  int iVar82;
  double *local_570;
  double *local_520;
  double *local_518;
  uint local_480;
  Box local_3fc;
  Array4<const_int> local_3e0;
  MultiCutFab *local_3a0;
  MultiCutFab *local_398;
  MultiCutFab *local_390;
  MultiCutFab *local_388;
  MultiCutFab *local_380;
  MultiCutFab *local_378;
  Array4<const_double> local_370;
  undefined1 local_330 [32];
  Dim3 local_310 [2];
  int iStack_2f8;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Box local_22c;
  Array4<const_double> local_210;
  undefined1 local_1d0 [16];
  FArrayBox *local_1c0;
  Long LStack_1b8;
  Long local_1b0;
  Long LStack_1a8;
  Dim3 local_1a0 [2];
  int iStack_188;
  double *local_180;
  long local_178;
  long local_170;
  long local_168;
  int local_160;
  int local_15c;
  int local_158;
  Dim3 local_154;
  int local_148;
  double local_140;
  double *local_138;
  long local_130;
  long local_128;
  long local_120;
  Dim3 local_118;
  ulong local_10c;
  int local_104;
  int local_100;
  double *local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Dim3 local_d8;
  ulong local_cc;
  int local_c4;
  int local_c0;
  MultiCutFab *local_b8;
  MultiCutFab *pMStack_b0;
  MultiCutFab *local_a8;
  Long LStack_a0;
  Dim3 aDStack_98 [2];
  int iStack_80;
  int *local_78;
  Long LStack_70;
  Long local_68;
  Long LStack_60;
  Dim3 local_58 [2];
  int iStack_40;
  bool local_38;
  bool local_37;
  
  MFIter::tilebox(&local_3fc,mfi);
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  lVar61 = **(long **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar61 == 0) {
    lVar61 = 0;
    pFVar38 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    lVar37 = __dynamic_cast(lVar61,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo);
    pFVar38 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar61 = 0;
    if (lVar37 != 0) {
      pFVar38 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar37 + 0xd8));
      lVar61 = lVar37;
    }
  }
  lVar37 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  pVVar18 = mfi->local_index_map;
  piVar41 = &mfi->currentIndex;
  piVar67 = piVar41;
  if (pVVar18 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar67 = (pVVar18->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar41;
  }
  lVar69 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar57 = (long)*piVar67;
  pFVar19 = *(FArrayBox **)(*(long *)(lVar37 + 0x108) + lVar57 * 8);
  pFVar20 = *(FArrayBox **)(*(long *)(lVar37 + 0x288) + lVar57 * 8);
  pFVar21 = *(FArrayBox **)(*(long *)(lVar37 + 0x408) + lVar57 * 8);
  iVar56 = local_3fc.bigend.vect[1] + (uint)((local_3fc.btype.itype & 2) == 0);
  iVar43 = local_3fc.bigend.vect[2] + (uint)((local_3fc.btype.itype & 4) == 0);
  if (pFVar38 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
    pFVar22 = flux->_M_elems[0];
    pFVar23 = flux->_M_elems[1];
    pFVar24 = flux->_M_elems[2];
    if (pVVar18 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar41 = (pVVar18->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + *piVar41;
    }
    iVar40 = (pFVar22->super_BaseFab<double>).domain.bigend.vect[0];
    iVar44 = (pFVar22->super_BaseFab<double>).domain.bigend.vect[1];
    iVar35 = (pFVar23->super_BaseFab<double>).domain.bigend.vect[0];
    iVar60 = (pFVar23->super_BaseFab<double>).domain.bigend.vect[1];
    iVar6 = (pFVar22->super_BaseFab<double>).domain.smallend.vect[0];
    iVar51 = (pFVar22->super_BaseFab<double>).domain.smallend.vect[1];
    iVar47 = (pFVar22->super_BaseFab<double>).domain.bigend.vect[2];
    iVar7 = (pFVar23->super_BaseFab<double>).domain.smallend.vect[0];
    this_00 = *(FabArray<amrex::IArrayBox> **)
               &(this->m_cc_mask).
                super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>;
    iVar8 = (pFVar22->super_BaseFab<double>).domain.smallend.vect[2];
    local_570 = (pFVar22->super_BaseFab<double>).dptr;
    iVar36 = (pFVar22->super_BaseFab<double>).nvar;
    iVar9 = (pFVar23->super_BaseFab<double>).domain.smallend.vect[1];
    iVar73 = (pFVar23->super_BaseFab<double>).domain.bigend.vect[2];
    iVar10 = (pFVar23->super_BaseFab<double>).domain.smallend.vect[2];
    local_518 = (pFVar23->super_BaseFab<double>).dptr;
    iVar11 = (pFVar23->super_BaseFab<double>).nvar;
    iVar62 = (pFVar24->super_BaseFab<double>).domain.bigend.vect[0];
    iVar64 = (pFVar24->super_BaseFab<double>).domain.bigend.vect[1];
    iVar12 = (pFVar24->super_BaseFab<double>).domain.smallend.vect[0];
    iVar13 = (pFVar24->super_BaseFab<double>).domain.smallend.vect[1];
    iVar82 = (pFVar24->super_BaseFab<double>).domain.bigend.vect[2];
    iVar14 = (pFVar24->super_BaseFab<double>).domain.smallend.vect[2];
    local_520 = (pFVar24->super_BaseFab<double>).dptr;
    iVar15 = (pFVar24->super_BaseFab<double>).nvar;
    FVar34 = EBCellFlagFab::getType
                       ((pFVar38->m_fabs_v).
                        super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar41],&local_3fc);
    if (FVar34 != regular) {
      iVar40 = iVar40 + 1;
      iVar44 = iVar44 + 1;
      iVar35 = iVar35 + 1;
      iVar60 = iVar60 + 1;
      iVar62 = iVar62 + 1;
      iVar64 = iVar64 + 1;
      iVar47 = iVar47 + 1;
      iVar73 = iVar73 + 1;
      iVar82 = iVar82 + 1;
      local_178 = (long)(iVar40 - iVar6);
      lVar52 = (long)(iVar44 - iVar51);
      lVar37 = (long)(iVar35 - iVar7);
      lVar57 = (long)(iVar60 - iVar9);
      lVar48 = (long)(iVar62 - iVar12);
      lVar68 = (long)(iVar64 - iVar13);
      lVar53 = lVar52 * local_178;
      lVar63 = lVar57 * lVar37;
      lVar45 = lVar68 * lVar48;
      iVar76 = (~local_3fc.btype.itype & 1) + local_3fc.bigend.vect[0];
      lVar78 = (iVar47 - iVar8) * lVar53;
      lVar65 = (iVar73 - iVar10) * lVar63;
      lVar58 = (iVar82 - iVar14) * lVar45;
      if (FVar34 != covered) {
        local_154.y = iVar44;
        local_154.x = iVar40;
        uVar2._4_4_ = iVar60;
        uVar2._0_4_ = iVar35;
        uVar81._4_4_ = iVar64;
        uVar81._0_4_ = iVar62;
        local_180 = local_570;
        local_170 = lVar53;
        local_168 = lVar78;
        local_160 = iVar6;
        local_15c = iVar51;
        local_158 = iVar8;
        local_154.z = iVar47;
        local_148 = iVar36;
        local_1d0._8_4_ = iVar76;
        if (flux_loc == FaceCentroid) {
          local_480 = local_3fc.btype.itype | 1;
          EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar61 + 0xd8));
          EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar61 + 0xd8));
          MultiCutFab::const_array(&local_270,local_388,mfi);
          MultiCutFab::const_array(&local_2b0,local_380,mfi);
          MultiCutFab::const_array(&local_2f0,local_378,mfi);
          MultiCutFab::const_array((Array4<const_double> *)local_330,local_3a0,mfi);
          MultiCutFab::const_array(&local_370,local_398,mfi);
          MultiCutFab::const_array(&local_210,local_390,mfi);
          pBVar1 = &(sol->super_BaseFab<double>).domain;
          uVar27._0_4_ = (pBVar1->smallend).vect[0];
          uVar27._4_4_ = (pBVar1->smallend).vect[1];
          lVar57 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          lVar61 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[0];
          lVar59 = (lVar61 - (pBVar1->smallend).vect[0]) + 1;
          uVar39 = lVar61 + 1U & 0xffffffff | lVar57 << 0x20;
          pBVar1 = &(pFVar19->super_BaseFab<double>).domain;
          uVar28._0_4_ = (pBVar1->smallend).vect[0];
          uVar28._4_4_ = (pBVar1->smallend).vect[1];
          lVar54 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          lVar78 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[0];
          lVar77 = (lVar78 - (pBVar1->smallend).vect[0]) + 1;
          lVar49 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          pBVar1 = &(pFVar20->super_BaseFab<double>).domain;
          uVar29._0_4_ = (pBVar1->smallend).vect[0];
          uVar29._4_4_ = (pBVar1->smallend).vect[1];
          lVar79 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
          lVar70 = (lVar79 - (pBVar1->smallend).vect[0]) + 1;
          lVar71 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          pBVar1 = &(pFVar21->super_BaseFab<double>).domain;
          uVar30._0_4_ = (pBVar1->smallend).vect[0];
          uVar30._4_4_ = (pBVar1->smallend).vect[1];
          lVar46 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[0];
          lVar75 = (lVar46 - (pBVar1->smallend).vect[0]) + 1;
          pdVar74 = (sol->super_BaseFab<double>).dptr;
          iVar40 = (sol->super_BaseFab<double>).nvar;
          iVar44 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
          lVar61 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          lVar66 = (lVar57 - (sol->super_BaseFab<double>).domain.smallend.vect[1]) * lVar59;
          lVar57 = (lVar61 - iVar44) * lVar66;
          pdVar80 = (pFVar19->super_BaseFab<double>).dptr;
          iVar35 = (pFVar19->super_BaseFab<double>).nvar;
          iVar60 = (pFVar19->super_BaseFab<double>).domain.smallend.vect[2];
          lVar52 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          lVar55 = (lVar54 - (pFVar19->super_BaseFab<double>).domain.smallend.vect[1]) * lVar77;
          pdVar25 = (pFVar20->super_BaseFab<double>).dptr;
          iVar6 = (pFVar20->super_BaseFab<double>).nvar;
          iVar51 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
          lVar53 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          lVar50 = (lVar49 - (pFVar20->super_BaseFab<double>).domain.smallend.vect[1]) * lVar70;
          pdVar26 = (pFVar21->super_BaseFab<double>).dptr;
          iVar47 = (pFVar21->super_BaseFab<double>).nvar;
          iVar8 = (pFVar21->super_BaseFab<double>).domain.smallend.vect[2];
          lVar68 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          lVar72 = (lVar71 - (pFVar21->super_BaseFab<double>).domain.smallend.vect[1]) * lVar75;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_3e0,this_00,mfi);
          dVar3 = this->m_b_scalar;
          local_140 = *(double *)(lVar69 + 0x38) * dVar3;
          dVar4 = *(double *)(lVar69 + 0x40);
          dVar5 = *(double *)(lVar69 + 0x48);
          LVar16 = this->m_beta_loc;
          LVar17 = this->m_phi_loc;
          if (LVar17 == CellCentroid) {
            Abort_host("phi_on_centroid is still a WIP");
          }
          local_22c.smallend.vect[0] = local_3fc.smallend.vect[0];
          local_22c.smallend.vect[1] = local_3fc.smallend.vect[1];
          local_22c.smallend.vect[2] = local_3fc.smallend.vect[2];
          local_22c.bigend.vect[1] = local_3fc.bigend.vect[1];
          local_22c.bigend.vect[2] = local_3fc.bigend.vect[2];
          local_22c.btype.itype = local_480;
          local_1d0._4_4_ = local_3fc.smallend.vect[0];
          local_1d0._0_4_ = face_only;
          local_1c0 = (FArrayBox *)local_270.p;
          LStack_1b8 = local_270.jstride;
          local_1b0 = local_270.kstride;
          LStack_1a8 = local_270.nstride;
          local_1a0[0].x = local_270.begin.x;
          local_1a0[0].y = local_270.begin.y;
          local_1a0[1].z = local_270.end.z;
          iStack_188 = local_270.ncomp;
          local_104 = (int)lVar52;
          local_38 = LVar16 == FaceCentroid;
          iVar36 = (int)lVar61;
          local_37 = LVar17 == CellCentroid;
          aDStack_98[1].z = local_310[1].z;
          iStack_80 = iStack_2f8;
          aDStack_98[0].x = local_310[0].x;
          aDStack_98[0].y = local_310[0].y;
          local_78 = local_3e0.p;
          LStack_70 = local_3e0.jstride;
          local_68 = local_3e0.kstride;
          LStack_60 = local_3e0.nstride;
          local_58[0].x = local_3e0.begin.x;
          local_58[0].y = local_3e0.begin.y;
          local_58[1].z = local_3e0.end.z;
          iStack_40 = local_3e0.ncomp;
          local_22c.bigend.vect[0] = iVar76;
          local_138 = pdVar80;
          local_130 = lVar77;
          local_128 = lVar55;
          local_120 = (lVar52 - iVar60) * lVar55;
          local_118._0_8_ = uVar28;
          local_118.z = iVar60;
          local_10c = lVar78 + 1U & 0xffffffff | lVar54 << 0x20;
          local_100 = iVar35;
          local_f8 = pdVar74;
          local_f0 = lVar59;
          local_e8 = lVar66;
          local_e0 = lVar57;
          local_d8._0_8_ = uVar27;
          local_d8.z = iVar44;
          local_cc = uVar39;
          local_c4 = iVar36;
          local_c0 = iVar40;
          LoopConcurrent<amrex::mlebabeclap_flux_x(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                    (&local_22c,ncomp,(anon_class_416_12_0bbc6dcc *)local_1d0);
          local_22c.smallend.vect[0] = local_3fc.smallend.vect[0];
          local_22c.smallend.vect[1] = local_3fc.smallend.vect[1];
          local_22c.smallend.vect[2] = local_3fc.smallend.vect[2];
          local_22c.bigend.vect[0] = local_3fc.bigend.vect[0];
          local_22c.bigend.vect[2] = local_3fc.bigend.vect[2];
          local_1d0._4_4_ = local_3fc.smallend.vect[1];
          local_1c0 = (FArrayBox *)local_2b0.p;
          LStack_1b8 = local_2b0.jstride;
          local_1b0 = local_2b0.kstride;
          LStack_1a8 = local_2b0.nstride;
          local_1a0[0].x = local_2b0.begin.x;
          local_1a0[0].y = local_2b0.begin.y;
          local_1a0[1].z = local_2b0.end.z;
          iStack_188 = local_2b0.ncomp;
          local_104 = (int)lVar53;
          local_38 = LVar16 == FaceCentroid;
          local_37 = LVar17 == CellCentroid;
          aDStack_98[1].z = local_370.end.z;
          iStack_80 = local_370.ncomp;
          aDStack_98[0].x = local_370.begin.x;
          aDStack_98[0].y = local_370.begin.y;
          local_a8 = (MultiCutFab *)local_370.kstride;
          LStack_a0 = local_370.nstride;
          local_b8 = (MultiCutFab *)local_370.p;
          pMStack_b0 = (MultiCutFab *)local_370.jstride;
          local_78 = local_3e0.p;
          LStack_70 = local_3e0.jstride;
          local_68 = local_3e0.kstride;
          LStack_60 = local_3e0.nstride;
          local_58[0].x = local_3e0.begin.x;
          local_58[0].y = local_3e0.begin.y;
          local_58[1].z = local_3e0.end.z;
          iStack_40 = local_3e0.ncomp;
          local_22c.bigend.vect[1] = iVar56;
          local_22c.btype.itype = local_3fc.btype.itype | 2;
          local_180 = local_518;
          local_178 = lVar37;
          local_170 = lVar63;
          local_168 = lVar65;
          local_160 = iVar7;
          local_15c = iVar9;
          local_158 = iVar10;
          local_154._0_8_ = uVar2;
          local_154.z = iVar73;
          local_148 = iVar11;
          local_140 = dVar4 * dVar3;
          local_138 = pdVar25;
          local_130 = lVar70;
          local_128 = lVar50;
          local_120 = (lVar53 - iVar51) * lVar50;
          local_118._0_8_ = uVar29;
          local_118.z = iVar51;
          local_10c = lVar79 + 1U & 0xffffffff | lVar49 << 0x20;
          local_100 = iVar6;
          local_f8 = pdVar74;
          local_f0 = lVar59;
          local_e8 = lVar66;
          local_e0 = lVar57;
          local_d8._0_8_ = uVar27;
          local_d8.z = iVar44;
          local_cc = uVar39;
          local_c4 = iVar36;
          local_c0 = iVar40;
          local_1d0._8_4_ = iVar56;
          LoopConcurrent<amrex::mlebabeclap_flux_y(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                    (&local_22c,ncomp,(anon_class_416_12_3e7d91eb *)local_1d0);
          local_22c.smallend.vect[0] = local_3fc.smallend.vect[0];
          local_22c.smallend.vect[1] = local_3fc.smallend.vect[1];
          local_22c.smallend.vect[2] = local_3fc.smallend.vect[2];
          local_22c.bigend.vect[0] = local_3fc.bigend.vect[0];
          local_22c.bigend.vect[1] = local_3fc.bigend.vect[1];
          local_38 = LVar16 == FaceCentroid;
          local_1d0._4_4_ = local_3fc.smallend.vect[2];
          local_1d0._8_4_ = iVar43;
          local_1c0 = (FArrayBox *)local_2f0.p;
          LStack_1b8 = local_2f0.jstride;
          local_1b0 = local_2f0.kstride;
          LStack_1a8 = local_2f0.nstride;
          local_1a0[0].x = local_2f0.begin.x;
          local_1a0[0].y = local_2f0.begin.y;
          local_1a0[1].z = local_2f0.end.z;
          iStack_188 = local_2f0.ncomp;
          local_104 = (int)lVar68;
          local_37 = LVar17 == CellCentroid;
          aDStack_98[1].z = local_210.end.z;
          iStack_80 = local_210.ncomp;
          aDStack_98[0].x = local_210.begin.x;
          aDStack_98[0].y = local_210.begin.y;
          local_a8 = (MultiCutFab *)local_210.kstride;
          LStack_a0 = local_210.nstride;
          local_b8 = (MultiCutFab *)local_210.p;
          pMStack_b0 = (MultiCutFab *)local_210.jstride;
          local_78 = local_3e0.p;
          LStack_70 = local_3e0.jstride;
          local_68 = local_3e0.kstride;
          LStack_60 = local_3e0.nstride;
          local_58[0].x = local_3e0.begin.x;
          local_58[0].y = local_3e0.begin.y;
          local_58[1].z = local_3e0.end.z;
          iStack_40 = local_3e0.ncomp;
          local_22c.bigend.vect[2] = iVar43;
          local_22c.btype.itype = local_3fc.btype.itype | 4;
          local_180 = local_520;
          local_178 = lVar48;
          local_170 = lVar45;
          local_168 = lVar58;
          local_160 = iVar12;
          local_15c = iVar13;
          local_158 = iVar14;
          local_154._0_8_ = uVar81;
          local_154.z = iVar82;
          local_148 = iVar15;
          local_140 = dVar3 * dVar5;
          local_138 = pdVar26;
          local_130 = lVar75;
          local_128 = lVar72;
          local_120 = (lVar68 - iVar8) * lVar72;
          local_118._0_8_ = uVar30;
          local_118.z = iVar8;
          local_10c = lVar46 + 1U & 0xffffffff | lVar71 << 0x20;
          local_100 = iVar47;
          local_f8 = pdVar74;
          local_f0 = lVar59;
          local_e8 = lVar66;
          local_e0 = lVar57;
          local_d8._0_8_ = uVar27;
          local_d8.z = iVar44;
          local_cc = uVar39;
          local_c4 = iVar36;
          local_c0 = iVar40;
          LoopConcurrent<amrex::mlebabeclap_flux_z(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                    (&local_22c,ncomp,(anon_class_416_12_713eb60a *)local_1d0);
          return;
        }
        EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar61 + 0xd8));
        MultiCutFab::const_array(&local_270,(MultiCutFab *)local_370.p,mfi);
        MultiCutFab::const_array(&local_2b0,(MultiCutFab *)local_370.jstride,mfi);
        MultiCutFab::const_array(&local_2f0,(MultiCutFab *)local_370.kstride,mfi);
        lVar53 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(sol->super_BaseFab<double>).domain;
        uVar33._0_4_ = (pBVar1->smallend).vect[0];
        uVar33._4_4_ = (pBVar1->smallend).vect[1];
        lVar57 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[0];
        lVar61 = (lVar57 - (pBVar1->smallend).vect[0]) + 1;
        uVar39 = lVar57 + 1U & 0xffffffff | lVar53 << 0x20;
        lVar78 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar19->super_BaseFab<double>).domain;
        local_118.x = (pBVar1->smallend).vect[0];
        local_118.y = (pBVar1->smallend).vect[1];
        lVar57 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[0];
        local_130 = (lVar57 - (pBVar1->smallend).vect[0]) + 1;
        local_10c = lVar57 + 1U & 0xffffffff | lVar78 << 0x20;
        lVar68 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar20->super_BaseFab<double>).domain;
        uVar31._0_4_ = (pBVar1->smallend).vect[0];
        uVar31._4_4_ = (pBVar1->smallend).vect[1];
        lVar49 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
        lVar57 = (lVar49 - (pBVar1->smallend).vect[0]) + 1;
        lVar52 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar21->super_BaseFab<double>).domain;
        uVar32._0_4_ = (pBVar1->smallend).vect[0];
        uVar32._4_4_ = (pBVar1->smallend).vect[1];
        lVar50 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[0];
        lVar46 = (lVar50 - (pBVar1->smallend).vect[0]) + 1;
        dVar3 = this->m_b_scalar;
        local_140 = *(double *)(lVar69 + 0x38) * dVar3;
        dVar4 = *(double *)(lVar69 + 0x40);
        dVar5 = *(double *)(lVar69 + 0x48);
        pdVar74 = (sol->super_BaseFab<double>).dptr;
        iVar40 = (sol->super_BaseFab<double>).nvar;
        iVar44 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
        local_138 = (pFVar19->super_BaseFab<double>).dptr;
        local_100 = (pFVar19->super_BaseFab<double>).nvar;
        local_118.z = (pFVar19->super_BaseFab<double>).domain.smallend.vect[2];
        pdVar80 = (pFVar20->super_BaseFab<double>).dptr;
        iVar35 = (pFVar20->super_BaseFab<double>).nvar;
        iVar60 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
        pdVar25 = (pFVar21->super_BaseFab<double>).dptr;
        iVar6 = (pFVar21->super_BaseFab<double>).nvar;
        iVar51 = (pFVar21->super_BaseFab<double>).domain.smallend.vect[2];
        local_330._0_4_ = local_3fc.smallend.vect[0];
        local_330._4_4_ = local_3fc.smallend.vect[1];
        local_330._8_4_ = local_3fc.smallend.vect[2];
        local_330._16_4_ = local_3fc.bigend.vect[1];
        local_330._20_4_ = local_3fc.bigend.vect[2];
        local_1d0._4_4_ = local_3fc.smallend.vect[0];
        local_1d0._0_4_ = face_only;
        local_1c0 = (FArrayBox *)local_270.p;
        LStack_1b8 = local_270.jstride;
        local_1b0 = local_270.kstride;
        LStack_1a8 = local_270.nstride;
        local_1a0[0].x = local_270.begin.x;
        local_1a0[0].y = local_270.begin.y;
        local_1a0[1].z = local_270.end.z;
        iStack_188 = local_270.ncomp;
        local_128 = (lVar78 - (pFVar19->super_BaseFab<double>).domain.smallend.vect[1]) * local_130;
        lVar69 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        local_120 = (lVar69 - local_118.z) * local_128;
        local_104 = (int)lVar69;
        lVar79 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar54 = (lVar53 - (sol->super_BaseFab<double>).domain.smallend.vect[1]) * lVar61;
        lVar59 = (lVar79 - iVar44) * lVar54;
        lVar55 = (long)(pFVar20->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar53 = (lVar68 - (pFVar20->super_BaseFab<double>).domain.smallend.vect[1]) * lVar57;
        lVar78 = (long)(pFVar21->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar69 = (lVar52 - (pFVar21->super_BaseFab<double>).domain.smallend.vect[1]) * lVar46;
        iVar47 = (int)lVar79;
        local_330._12_4_ = iVar76;
        local_330._24_4_ = local_3fc.btype.itype | 1;
        local_f8 = pdVar74;
        local_f0 = lVar61;
        local_e8 = lVar54;
        local_e0 = lVar59;
        local_d8._0_8_ = uVar33;
        local_d8.z = iVar44;
        local_cc = uVar39;
        local_c4 = iVar47;
        local_c0 = iVar40;
        LoopConcurrent<amrex::mlebabeclap_flux_x_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                  ((Box *)local_330,ncomp,(anon_class_280_8_76b9537a *)local_1d0);
        local_330._0_4_ = local_3fc.smallend.vect[0];
        local_330._4_4_ = local_3fc.smallend.vect[1];
        local_330._8_4_ = local_3fc.smallend.vect[2];
        local_330._12_4_ = local_3fc.bigend.vect[0];
        local_330._20_4_ = local_3fc.bigend.vect[2];
        local_1d0._4_4_ = local_3fc.smallend.vect[1];
        local_1c0 = (FArrayBox *)local_2b0.p;
        LStack_1b8 = local_2b0.jstride;
        local_1b0 = local_2b0.kstride;
        LStack_1a8 = local_2b0.nstride;
        local_1a0[0].x = local_2b0.begin.x;
        local_1a0[0].y = local_2b0.begin.y;
        local_1a0[1].z = local_2b0.end.z;
        iStack_188 = local_2b0.ncomp;
        local_104 = (int)lVar55;
        local_330._16_4_ = iVar56;
        local_330._24_4_ = local_3fc.btype.itype | 2;
        local_180 = local_518;
        local_178 = lVar37;
        local_170 = lVar63;
        local_168 = lVar65;
        local_160 = iVar7;
        local_15c = iVar9;
        local_158 = iVar10;
        local_154._0_8_ = uVar2;
        local_154.z = iVar73;
        local_148 = iVar11;
        local_140 = dVar4 * dVar3;
        local_138 = pdVar80;
        local_130 = lVar57;
        local_128 = lVar53;
        local_120 = (lVar55 - iVar60) * lVar53;
        local_118._0_8_ = uVar31;
        local_118.z = iVar60;
        local_10c = lVar49 + 1U & 0xffffffff | lVar68 << 0x20;
        local_100 = iVar35;
        local_f8 = pdVar74;
        local_f0 = lVar61;
        local_e8 = lVar54;
        local_e0 = lVar59;
        local_d8._0_8_ = uVar33;
        local_d8.z = iVar44;
        local_cc = uVar39;
        local_c4 = iVar47;
        local_c0 = iVar40;
        local_1d0._8_4_ = iVar56;
        LoopConcurrent<amrex::mlebabeclap_flux_y_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                  ((Box *)local_330,ncomp,(anon_class_280_8_76c7e33a *)local_1d0);
        local_330._0_4_ = local_3fc.smallend.vect[0];
        local_330._4_4_ = local_3fc.smallend.vect[1];
        local_330._8_4_ = local_3fc.smallend.vect[2];
        local_330._12_4_ = local_3fc.bigend.vect[0];
        local_330._16_4_ = local_3fc.bigend.vect[1];
        local_1d0._4_4_ = local_3fc.smallend.vect[2];
        local_1d0._8_4_ = iVar43;
        local_1c0 = (FArrayBox *)local_2f0.p;
        LStack_1b8 = local_2f0.jstride;
        local_1b0 = local_2f0.kstride;
        LStack_1a8 = local_2f0.nstride;
        local_1a0[0].x = local_2f0.begin.x;
        local_1a0[0].y = local_2f0.begin.y;
        local_1a0[1].z = local_2f0.end.z;
        iStack_188 = local_2f0.ncomp;
        local_104 = (int)lVar78;
        local_330._20_4_ = iVar43;
        local_330._24_4_ = local_3fc.btype.itype | 4;
        local_180 = local_520;
        local_178 = lVar48;
        local_170 = lVar45;
        local_168 = lVar58;
        local_160 = iVar12;
        local_15c = iVar13;
        local_158 = iVar14;
        local_154._0_8_ = uVar81;
        local_154.z = iVar82;
        local_148 = iVar15;
        local_140 = dVar3 * dVar5;
        local_138 = pdVar25;
        local_130 = lVar46;
        local_128 = lVar69;
        local_120 = (lVar78 - iVar51) * lVar69;
        local_118._0_8_ = uVar32;
        local_118.z = iVar51;
        local_10c = lVar50 + 1U & 0xffffffff | lVar52 << 0x20;
        local_100 = iVar6;
        local_f8 = pdVar74;
        local_f0 = lVar61;
        local_e8 = lVar54;
        local_e0 = lVar59;
        local_d8._0_8_ = uVar33;
        local_d8.z = iVar44;
        local_cc = uVar39;
        local_c4 = iVar47;
        local_c0 = iVar40;
        LoopConcurrent<amrex::mlebabeclap_flux_z_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                  ((Box *)local_330,ncomp,(anon_class_280_8_76d672fa *)local_1d0);
        return;
      }
      if ((int)ncomp < 1) {
        return;
      }
      lVar61 = (long)local_3fc.smallend.vect[0];
      lVar69 = (long)local_3fc.smallend.vect[2];
      lVar79 = (long)local_3fc.smallend.vect[1];
      iVar44 = (local_3fc.bigend.vect[2] - local_3fc.smallend.vect[2]) + 1;
      local_570 = local_570 +
                  (((((lVar69 - iVar8) * lVar52 + lVar79) - (long)iVar51) * local_178 + lVar61) -
                  (long)iVar6);
      uVar39 = (ulong)ncomp;
      uVar42 = 0;
      do {
        if (local_3fc.smallend.vect[2] <= local_3fc.bigend.vect[2]) {
          iVar60 = 0;
          pdVar74 = local_570;
          do {
            pdVar80 = pdVar74;
            iVar51 = (local_3fc.bigend.vect[1] - local_3fc.smallend.vect[1]) + 1;
            if (local_3fc.smallend.vect[1] <= local_3fc.bigend.vect[1]) {
              do {
                if (local_3fc.smallend.vect[0] <= iVar76) {
                  memset(pdVar80,0,(ulong)(uint)(iVar76 - local_3fc.smallend.vect[0]) * 8 + 8);
                }
                pdVar80 = pdVar80 + ((long)iVar40 - (long)iVar6);
                iVar51 = iVar51 + -1;
              } while (iVar51 != 0);
            }
            iVar60 = iVar60 + 1;
            pdVar74 = pdVar74 + lVar53;
          } while (iVar44 != iVar60);
        }
        uVar42 = uVar42 + 1;
        local_570 = local_570 + lVar78;
      } while (uVar42 != uVar39);
      if ((int)ncomp < 1) {
        return;
      }
      local_518 = local_518 +
                  (((((lVar69 - iVar10) * lVar57 + lVar79) - (long)iVar9) * lVar37 + lVar61) -
                  (long)iVar7);
      uVar42 = 0;
      do {
        if (local_3fc.smallend.vect[2] <= local_3fc.bigend.vect[2]) {
          iVar40 = 0;
          pdVar74 = local_518;
          do {
            pdVar80 = pdVar74;
            iVar60 = (iVar56 - local_3fc.smallend.vect[1]) + 1;
            if (local_3fc.smallend.vect[1] <= iVar56) {
              do {
                if (local_3fc.smallend.vect[0] <= local_3fc.bigend.vect[0]) {
                  memset(pdVar80,0,
                         (ulong)(uint)(local_3fc.bigend.vect[0] - local_3fc.smallend.vect[0]) * 8 +
                         8);
                }
                pdVar80 = pdVar80 + ((long)iVar35 - (long)iVar7);
                iVar60 = iVar60 + -1;
              } while (iVar60 != 0);
            }
            iVar40 = iVar40 + 1;
            pdVar74 = pdVar74 + lVar63;
          } while (iVar44 != iVar40);
        }
        uVar42 = uVar42 + 1;
        local_518 = local_518 + lVar65;
      } while (uVar42 != uVar39);
      if ((int)ncomp < 1) {
        return;
      }
      local_520 = local_520 +
                  (((((lVar69 - iVar14) * lVar68 + lVar79) - (long)iVar13) * lVar48 + lVar61) -
                  (long)iVar12);
      uVar42 = 0;
      do {
        if (local_3fc.smallend.vect[2] <= iVar43) {
          iVar56 = 0;
          pdVar74 = local_520;
          do {
            pdVar80 = pdVar74;
            iVar40 = (local_3fc.bigend.vect[1] - local_3fc.smallend.vect[1]) + 1;
            if (local_3fc.smallend.vect[1] <= local_3fc.bigend.vect[1]) {
              do {
                if (local_3fc.smallend.vect[0] <= local_3fc.bigend.vect[0]) {
                  memset(pdVar80,0,
                         (ulong)(uint)(local_3fc.bigend.vect[0] - local_3fc.smallend.vect[0]) * 8 +
                         8);
                }
                pdVar80 = pdVar80 + ((long)iVar62 - (long)iVar12);
                iVar40 = iVar40 + -1;
              } while (iVar40 != 0);
            }
            iVar56 = iVar56 + 1;
            pdVar74 = pdVar74 + lVar45;
          } while ((iVar43 - local_3fc.smallend.vect[2]) + 1 != iVar56);
        }
        uVar42 = uVar42 + 1;
        local_520 = local_520 + lVar58;
      } while (uVar42 != uVar39);
      return;
    }
  }
  local_1d0._0_8_ = pFVar19;
  local_1d0._8_8_ = pFVar20;
  local_1c0 = pFVar21;
  MLABecLaplacian::FFlux
            (&local_3fc,(Real *)(lVar69 + 0x38),this->m_b_scalar,
             (Array<const_FArrayBox_*,_3> *)local_1d0,flux,sol,face_only,ncomp);
  return;
}

Assistant:

void
MLEBABecLap::FFlux (int amrlev, const MFIter& mfi, const Array<FArrayBox*,AMREX_SPACEDIM>& flux,
                    const FArrayBox& sol, Location flux_loc, const int face_only) const
{
    BL_PROFILE("MLEBABecLap::FFlux()");
    const int compute_flux_at_centroid = (Location::FaceCentroid == flux_loc) ? 1 : 0;
    const int mglev = 0;
    const Box& box = mfi.tilebox();
    const int ncomp = getNComp();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    AMREX_D_TERM(const auto& bx = m_b_coeffs[amrlev][mglev][0][mfi];,
                 const auto& by = m_b_coeffs[amrlev][mglev][1][mfi];,
                 const auto& bz = m_b_coeffs[amrlev][mglev][2][mfi];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(box,0);,
                 Box const& ybx = amrex::surroundingNodes(box,1);,
                 Box const& zbx = amrex::surroundingNodes(box,2););
    AMREX_D_TERM(Array4<Real> const& fx = flux[0]->array();,
                 Array4<Real> const& fy = flux[1]->array();,
                 Array4<Real> const& fz = flux[2]->array(););

    const auto fabtyp = (flags) ? (*flags)[mfi].getType(box) : FabType::regular;
    if (fabtyp == FabType::covered) {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(xbx, ncomp, i, j, k, n,
        {
            fx(i,j,k,n) = 0.0;
        });
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(ybx, ncomp, i, j, k, n,
        {
            fy(i,j,k,n) = 0.0;
        });
#if (AMREX_SPACEDIM == 3)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(zbx, ncomp, i, j, k, n,
        {
            fz(i,j,k,n) = 0.0;
        });
#endif
    } else if (fabtyp == FabType::regular) {
        MLABecLaplacian::FFlux(box, dxinv, m_b_scalar,
                               Array<FArrayBox const*,AMREX_SPACEDIM>{AMREX_D_DECL(&bx,&by,&bz)},
                               flux, sol, face_only, ncomp);
    } else if (compute_flux_at_centroid) {
        const auto& area = factory->getAreaFrac();
        const auto& fcent = factory->getFaceCent();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                     Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                     Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        Array4<int const> const& msk = ccmask.const_array(mfi);
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
        bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

        if (phi_on_centroid) amrex::Abort("phi_on_centroid is still a WIP");

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x(txbx, fx, apx, fcx, phi, bxcoef, msk, dhx, face_only, ncomp, xbx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y(tybx, fy, apy, fcy, phi, bycoef, msk, dhy, face_only, ncomp, ybx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z(tzbx, fz, apz, fcz, phi, bzcoef, msk, dhz, face_only, ncomp, zbx,
                                   beta_on_centroid, phi_on_centroid);
            }
        );
    } else {
        const auto& area = factory->getAreaFrac();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x_0(txbx, fx, apx, phi, bxcoef, dhx, face_only, ncomp, xbx);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y_0(tybx, fy, apy, phi, bycoef, dhy, face_only, ncomp, ybx);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z_0(tzbx, fz, apz, phi, bzcoef, dhz, face_only, ncomp, zbx);
            }
        );
    }
}